

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.cpp
# Opt level: O0

void __thiscall
randomx::BytecodeMachine::compileInstruction
          (BytecodeMachine *this,Instruction *instr,int i,InstructionByteCode *ibc)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  byte bVar6;
  undefined4 uVar7;
  long *in_RCX;
  undefined4 in_EDX;
  uint uVar8;
  uint uVar9;
  Instruction *in_RSI;
  long in_RDI;
  int src_22;
  int dst_26;
  int src_21;
  uint j;
  int shift;
  int creg;
  int dst_25;
  int src_20;
  int dst_24;
  int src_19;
  int dst_23;
  int dst_22;
  int src_18;
  int dst_21;
  int src_17;
  int dst_20;
  int src_16;
  int dst_19;
  int src_15;
  int dst_18;
  int dst_17;
  int src_14;
  int dst_16;
  int src_13;
  int dst_15;
  int src_12;
  int dst_14;
  int src_11;
  int dst_13;
  int src_10;
  int dst_12;
  int dst_11;
  int dst_10;
  uint64_t divisor;
  int src_9;
  int dst_9;
  int src_8;
  int dst_8;
  int src_7;
  int dst_7;
  int src_6;
  int dst_6;
  int src_5;
  int dst_5;
  int src_4;
  int dst_4;
  int src_3;
  int dst_3;
  int src_2;
  int dst_2;
  int src_1;
  int dst_1;
  int src;
  int dst;
  int opcode;
  uint local_f8;
  
  uVar8 = (uint)in_RSI->opcode;
  if (uVar8 < 0x10) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 0;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    if (uVar8 == 5) {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModShift(in_RSI);
      *(short *)((long)in_RCX + 0x1a) = (short)iVar3;
      uVar4 = Instruction::getImm32((Instruction *)0x11a733);
      uVar5 = signExtend2sCompl(uVar4);
      in_RCX[2] = uVar5;
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModShift(in_RSI);
      *(short *)((long)in_RCX + 0x1a) = (short)iVar3;
      in_RCX[2] = 0;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x17) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 1;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11a7e7);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
    if (uVar9 == uVar8) {
      in_RCX[1] = (long)&zero;
      *(undefined4 *)((long)in_RCX + 0x1c) = 0x1ffff8;
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModMem(in_RSI);
      uVar7 = 0x3fff8;
      if (iVar3 != 0) {
        uVar7 = 0x3ff8;
      }
      *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x27) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 2;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    if (uVar9 == uVar8) {
      uVar4 = Instruction::getImm32((Instruction *)0x11a953);
      uVar5 = signExtend2sCompl(uVar4);
      in_RCX[2] = uVar5;
      in_RCX[1] = (long)(in_RCX + 2);
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x2e) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 3;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11aa1f);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
    if (uVar9 == uVar8) {
      in_RCX[1] = (long)&zero;
      *(undefined4 *)((long)in_RCX + 0x1c) = 0x1ffff8;
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModMem(in_RSI);
      uVar7 = 0x3fff8;
      if (iVar3 != 0) {
        uVar7 = 0x3ff8;
      }
      *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x3e) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 4;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    if (uVar9 == uVar8) {
      uVar4 = Instruction::getImm32((Instruction *)0x11ab8b);
      uVar5 = signExtend2sCompl(uVar4);
      in_RCX[2] = uVar5;
      in_RCX[1] = (long)(in_RCX + 2);
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x42) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 5;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11ac57);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
    if (uVar9 == uVar8) {
      in_RCX[1] = (long)&zero;
      *(undefined4 *)((long)in_RCX + 0x1c) = 0x1ffff8;
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModMem(in_RSI);
      uVar7 = 0x3fff8;
      if (iVar3 != 0) {
        uVar7 = 0x3ff8;
      }
      *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x46) {
    uVar8 = (uint)in_RSI->dst % 8;
    bVar6 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 6;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)((uint)bVar6 % 8) * 8;
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x47) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 7;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11ae38);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
    if (uVar9 == uVar8) {
      in_RCX[1] = (long)&zero;
      *(undefined4 *)((long)in_RCX + 0x1c) = 0x1ffff8;
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModMem(in_RSI);
      uVar7 = 0x3fff8;
      if (iVar3 != 0) {
        uVar7 = 0x3ff8;
      }
      *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x4b) {
    uVar8 = (uint)in_RSI->dst % 8;
    bVar6 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 8;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)((uint)bVar6 % 8) * 8;
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x4c) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 9;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11b019);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
    if (uVar9 == uVar8) {
      in_RCX[1] = (long)&zero;
      *(undefined4 *)((long)in_RCX + 0x1c) = 0x1ffff8;
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModMem(in_RSI);
      uVar7 = 0x3fff8;
      if (iVar3 != 0) {
        uVar7 = 0x3ff8;
      }
      *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x54) {
    uVar4 = Instruction::getImm32((Instruction *)0x11b0e8);
    bVar2 = isZeroOrPowerOf2((ulong)uVar4);
    if (bVar2) {
      *(undefined2 *)(in_RCX + 3) = 0x1d;
    }
    else {
      uVar8 = (uint)in_RSI->dst % 8;
      *(undefined2 *)(in_RCX + 3) = 4;
      *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
      uVar5 = randomx_reciprocal((ulong)uVar4);
      in_RCX[2] = uVar5;
      in_RCX[1] = (long)(in_RCX + 2);
      *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
    }
  }
  else if (uVar8 < 0x56) {
    uVar8 = (uint)in_RSI->dst % 8;
    *(undefined2 *)(in_RCX + 3) = 0xb;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x65) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 0xc;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    if (uVar9 == uVar8) {
      uVar4 = Instruction::getImm32((Instruction *)0x11b2d8);
      uVar5 = signExtend2sCompl(uVar4);
      in_RCX[2] = uVar5;
      in_RCX[1] = (long)(in_RCX + 2);
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x6a) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 0xd;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11b3a4);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
    if (uVar9 == uVar8) {
      in_RCX[1] = (long)&zero;
      *(undefined4 *)((long)in_RCX + 0x1c) = 0x1ffff8;
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      iVar3 = Instruction::getModMem(in_RSI);
      uVar7 = 0x3fff8;
      if (iVar3 != 0) {
        uVar7 = 0x3ff8;
      }
      *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x72) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 0xe;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    if (uVar9 == uVar8) {
      uVar4 = Instruction::getImm32((Instruction *)0x11b4fe);
      in_RCX[2] = (ulong)uVar4;
      in_RCX[1] = (long)(in_RCX + 2);
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x74) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    *(undefined2 *)(in_RCX + 3) = 0xf;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    if (uVar9 == uVar8) {
      uVar4 = Instruction::getImm32((Instruction *)0x11b5e5);
      in_RCX[2] = (ulong)uVar4;
      in_RCX[1] = (long)(in_RCX + 2);
    }
    else {
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
    }
    *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
  }
  else if (uVar8 < 0x78) {
    uVar8 = (uint)in_RSI->dst % 8;
    uVar9 = (uint)in_RSI->src % 8;
    if (uVar9 == uVar8) {
      *(undefined2 *)(in_RCX + 3) = 0x1d;
    }
    else {
      *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
      in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)uVar9 * 8;
      *(undefined2 *)(in_RCX + 3) = 0x10;
      *(undefined4 *)(in_RDI + (long)(int)uVar8 * 4) = in_EDX;
      *(undefined4 *)(in_RDI + (long)(int)uVar9 * 4) = in_EDX;
    }
  }
  else if (uVar8 < 0x7c) {
    uVar8 = (uint)in_RSI->dst % 8;
    *(undefined2 *)(in_RCX + 3) = 0x11;
    if (uVar8 < 4) {
      *in_RCX = *(long *)(in_RDI + 0x20) + 0x40 + (long)(int)uVar8 * 0x10;
    }
    else {
      *in_RCX = *(long *)(in_RDI + 0x20) + 0x80 + (long)(int)(uVar8 - 4) * 0x10;
    }
  }
  else if (uVar8 < 0x8c) {
    bVar6 = in_RSI->dst;
    bVar1 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 0x12;
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x40 + (long)(int)((uint)bVar6 % 4) * 0x10;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + 0xc0 + (long)(int)((uint)bVar1 % 4) * 0x10;
  }
  else if (uVar8 < 0x91) {
    bVar6 = in_RSI->dst;
    bVar1 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 0x13;
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x40 + (long)(int)((uint)bVar6 % 4) * 0x10;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)((uint)bVar1 % 8) * 8;
    iVar3 = Instruction::getModMem(in_RSI);
    uVar7 = 0x3fff8;
    if (iVar3 != 0) {
      uVar7 = 0x3ff8;
    }
    *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    uVar4 = Instruction::getImm32((Instruction *)0x11b8dd);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
  }
  else if (uVar8 < 0xa1) {
    bVar6 = in_RSI->dst;
    bVar1 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 0x14;
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x40 + (long)(int)((uint)bVar6 % 4) * 0x10;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + 0xc0 + (long)(int)((uint)bVar1 % 4) * 0x10;
  }
  else if (uVar8 < 0xa6) {
    bVar6 = in_RSI->dst;
    bVar1 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 0x15;
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x40 + (long)(int)((uint)bVar6 % 4) * 0x10;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)((uint)bVar1 % 8) * 8;
    iVar3 = Instruction::getModMem(in_RSI);
    uVar7 = 0x3fff8;
    if (iVar3 != 0) {
      uVar7 = 0x3ff8;
    }
    *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    uVar4 = Instruction::getImm32((Instruction *)0x11ba59);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
  }
  else if (uVar8 < 0xac) {
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x40 + (long)(int)((uint)in_RSI->dst % 4) * 0x10;
    *(undefined2 *)(in_RCX + 3) = 0x16;
  }
  else if (uVar8 < 0xcc) {
    bVar6 = in_RSI->dst;
    bVar1 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 0x17;
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x80 + (long)(int)((uint)bVar6 % 4) * 0x10;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + 0xc0 + (long)(int)((uint)bVar1 % 4) * 0x10;
  }
  else if (uVar8 < 0xd0) {
    bVar6 = in_RSI->dst;
    bVar1 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 0x18;
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x80 + (long)(int)((uint)bVar6 % 4) * 0x10;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)((uint)bVar1 % 8) * 8;
    iVar3 = Instruction::getModMem(in_RSI);
    uVar7 = 0x3fff8;
    if (iVar3 != 0) {
      uVar7 = 0x3ff8;
    }
    *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    uVar4 = Instruction::getImm32((Instruction *)0x11bc37);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
  }
  else if (uVar8 < 0xd6) {
    bVar6 = in_RSI->dst;
    *(undefined2 *)(in_RCX + 3) = 0x19;
    *in_RCX = *(long *)(in_RDI + 0x20) + 0x80 + (long)(int)((uint)bVar6 % 4) * 0x10;
  }
  else if (uVar8 < 0xef) {
    *(undefined2 *)(in_RCX + 3) = 0x1a;
    uVar8 = (uint)in_RSI->dst % 8;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)uVar8 * 8;
    *(short *)((long)in_RCX + 0x1a) = (short)*(undefined4 *)(in_RDI + (long)(int)uVar8 * 4);
    iVar3 = Instruction::getModCond(in_RSI);
    bVar6 = (char)iVar3 + 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11bd40);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5 | 1L << (bVar6 & 0x3f);
    in_RCX[2] = (1L << ((char)iVar3 + 7U & 0x3f) ^ 0xffffffffffffffffU) & in_RCX[2];
    *(int *)((long)in_RCX + 0x1c) = 0xff << (bVar6 & 0x1f);
    for (local_f8 = 0; local_f8 < 8; local_f8 = local_f8 + 1) {
      *(undefined4 *)(in_RDI + (ulong)local_f8 * 4) = in_EDX;
    }
  }
  else if (uVar8 < 0xf0) {
    in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)((uint)in_RSI->src % 8) * 8;
    *(undefined2 *)(in_RCX + 3) = 0x1b;
    uVar4 = Instruction::getImm32((Instruction *)0x11be43);
    in_RCX[2] = (ulong)(uVar4 & 0x3f);
  }
  else if (uVar8 < 0x100) {
    bVar6 = in_RSI->dst;
    bVar1 = in_RSI->src;
    *(undefined2 *)(in_RCX + 3) = 0x1c;
    *in_RCX = *(long *)(in_RDI + 0x20) + (long)(int)((uint)bVar6 % 8) * 8;
    in_RCX[1] = *(long *)(in_RDI + 0x20) + (long)(int)((uint)bVar1 % 8) * 8;
    uVar4 = Instruction::getImm32((Instruction *)0x11bef3);
    uVar5 = signExtend2sCompl(uVar4);
    in_RCX[2] = uVar5;
    iVar3 = Instruction::getModCond(in_RSI);
    if (iVar3 < 0xe) {
      iVar3 = Instruction::getModMem(in_RSI);
      uVar7 = 0x3fff8;
      if (iVar3 != 0) {
        uVar7 = 0x3ff8;
      }
      *(undefined4 *)((long)in_RCX + 0x1c) = uVar7;
    }
    else {
      *(undefined4 *)((long)in_RCX + 0x1c) = 0x1ffff8;
    }
  }
  else if (uVar8 < 0x100) {
    *(undefined2 *)(in_RCX + 3) = 0x1d;
  }
  return;
}

Assistant:

void BytecodeMachine::compileInstruction(RANDOMX_GEN_ARGS) {
		int opcode = instr.opcode;

		if (opcode < ceil_IADD_RS) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IADD_RS;
			ibc.idst = &nreg->r[dst];
			if (dst != RegisterNeedsDisplacement) {
				ibc.isrc = &nreg->r[src];
				ibc.shift = instr.getModShift();
				ibc.imm = 0;
			}
			else {
				ibc.isrc = &nreg->r[src];
				ibc.shift = instr.getModShift();
				ibc.imm = signExtend2sCompl(instr.getImm32());
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IADD_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IADD_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISUB_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISUB_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISUB_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISUB_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMUL_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMUL_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMULH_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMULH_R;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMULH_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMULH_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISMULH_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISMULH_R;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISMULH_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISMULH_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_RCP) {
			uint64_t divisor = instr.getImm32();
			if (!isZeroOrPowerOf2(divisor)) {
				auto dst = instr.dst % RegistersCount;
				ibc.type = InstructionType::IMUL_R;
				ibc.idst = &nreg->r[dst];
				ibc.imm = randomx_reciprocal(divisor);
				ibc.isrc = &ibc.imm;
				registerUsage[dst] = i;
			}
			else {
				ibc.type = InstructionType::NOP;
			}
			return;
		}

		if (opcode < ceil_INEG_R) {
			auto dst = instr.dst % RegistersCount;
			ibc.type = InstructionType::INEG_R;
			ibc.idst = &nreg->r[dst];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IXOR_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IXOR_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IXOR_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IXOR_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IROR_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IROR_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = instr.getImm32();
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IROL_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IROL_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = instr.getImm32();
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISWAP_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			if (src != dst) {
				ibc.idst = &nreg->r[dst];
				ibc.isrc = &nreg->r[src];
				ibc.type = InstructionType::ISWAP_R;
				registerUsage[dst] = i;
				registerUsage[src] = i;
			}
			else {
				ibc.type = InstructionType::NOP;
			}
			return;
		}

		if (opcode < ceil_FSWAP_R) {
			auto dst = instr.dst % RegistersCount;
			ibc.type = InstructionType::FSWAP_R;
			if (dst < RegisterCountFlt)
				ibc.fdst = &nreg->f[dst];
			else
				ibc.fdst = &nreg->e[dst - RegisterCountFlt];
			return;
		}

		if (opcode < ceil_FADD_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FADD_R;
			ibc.fdst = &nreg->f[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FADD_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FADD_M;
			ibc.fdst = &nreg->f[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSUB_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FSUB_R;
			ibc.fdst = &nreg->f[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FSUB_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FSUB_M;
			ibc.fdst = &nreg->f[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSCAL_R) {
			auto dst = instr.dst % RegisterCountFlt;
			ibc.fdst = &nreg->f[dst];
			ibc.type = InstructionType::FSCAL_R;
			return;
		}

		if (opcode < ceil_FMUL_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FMUL_R;
			ibc.fdst = &nreg->e[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FDIV_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FDIV_M;
			ibc.fdst = &nreg->e[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSQRT_R) {
			auto dst = instr.dst % RegisterCountFlt;
			ibc.type = InstructionType::FSQRT_R;
			ibc.fdst = &nreg->e[dst];
			return;
		}

		if (opcode < ceil_CBRANCH) {
			ibc.type = InstructionType::CBRANCH;
			//jump condition
			int creg = instr.dst % RegistersCount;
			ibc.idst = &nreg->r[creg];
			ibc.target = registerUsage[creg];
			int shift = instr.getModCond() + ConditionOffset;
			ibc.imm = signExtend2sCompl(instr.getImm32()) | (1ULL << shift);
			if (ConditionOffset > 0 || shift > 0) //clear the bit below the condition mask - this limits the number of successive jumps to 2
				ibc.imm &= ~(1ULL << (shift - 1));
			ibc.memMask = ConditionMask << shift;
			//mark all registers as used
			for (unsigned j = 0; j < RegistersCount; ++j) {
				registerUsage[j] = i;
			}
			return;
		}

		if (opcode < ceil_CFROUND) {
			auto src = instr.src % RegistersCount;
			ibc.isrc = &nreg->r[src];
			ibc.type = InstructionType::CFROUND;
			ibc.imm = instr.getImm32() & 63;
			return;
		}

		if (opcode < ceil_ISTORE) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISTORE;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (instr.getModCond() < StoreL3Condition)
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			else
				ibc.memMask = ScratchpadL3Mask;
			return;
		}

		if (opcode < ceil_NOP) {
			ibc.type = InstructionType::NOP;
			return;
		}

		UNREACHABLE;
	}